

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Int i)

{
  int iVar1;
  char **s;
  DasmStyle *pDVar2;
  char *pcVar3;
  int iVar4;
  u64 value;
  double dVar5;
  
  s = &this->ptr;
  value = (u64)i.raw;
  pDVar2 = this->style;
  if ((pDVar2->numberFormat).radix == '\n') {
    sprintd_signed(s,value);
  }
  else {
    if (i.raw < 0) {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = '-';
      value = -value;
    }
    if (value == 0) {
      iVar4 = 1;
    }
    else {
      dVar5 = log2((double)(long)value);
      iVar1 = (int)dVar5 + 4;
      iVar4 = (int)dVar5 + 7;
      if (-1 < iVar1) {
        iVar4 = iVar1;
      }
      iVar4 = iVar4 >> 2;
    }
    sprintx(s,value,&pDVar2->numberFormat,iVar4);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Int i)
{
    sprint_signed(ptr, i.raw, style.numberFormat);
    return *this;
}